

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pffft.c
# Opt level: O2

void pffft_real_finalize(int Ncvec,v4sf *in,v4sf *out,v4sf *e)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  v4sf *pafVar11;
  long lVar12;
  long lVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  
  if (in != out) {
    fVar24 = in[7][0];
    fVar33 = in[7][1];
    fVar35 = in[7][2];
    fVar18 = in[7][3];
    pafVar11 = in + (long)(Ncvec * 2) + -1;
    fVar8 = (*pafVar11)[0];
    fVar14 = (*pafVar11)[1];
    fVar9 = (*pafVar11)[2];
    fVar10 = (*pafVar11)[3];
    fVar23 = (*in)[0];
    fVar38 = (*in)[1];
    fVar15 = (*in)[2];
    fVar16 = (*in)[3];
    fVar28 = (*e)[0] * 0.0 - e[1][0] * 0.0;
    fVar29 = in[1][1] * (*e)[1] - e[1][1] * in[2][1];
    fVar30 = in[3][1] * (*e)[2] - e[1][2] * in[4][1];
    fVar31 = in[5][1] * (*e)[3] - e[1][3] * in[6][1];
    fVar32 = (*e)[0] * 0.0 + e[1][0] * 0.0;
    fVar34 = in[2][1] * (*e)[1] + in[1][1] * e[1][1];
    fVar36 = in[4][1] * (*e)[2] + in[3][1] * e[1][2];
    fVar37 = in[6][1] * (*e)[3] + in[5][1] * e[1][3];
    fVar39 = e[2][0] * 0.0 - e[3][0] * 0.0;
    fVar41 = in[1][2] * e[2][1] - e[3][1] * in[2][2];
    fVar43 = in[3][2] * e[2][2] - e[3][2] * in[4][2];
    fVar45 = in[5][2] * e[2][3] - e[3][3] * in[6][2];
    fVar47 = e[2][0] * 0.0 + e[3][0] * 0.0;
    fVar49 = in[2][2] * e[2][1] + in[1][2] * e[3][1];
    fVar51 = in[4][2] * e[2][2] + in[3][2] * e[3][2];
    fVar53 = in[6][2] * e[2][3] + in[5][2] * e[3][3];
    fVar17 = e[4][0] * 0.0 - e[5][0] * 0.0;
    fVar19 = in[1][3] * e[4][1] - e[5][1] * in[2][3];
    fVar20 = in[3][3] * e[4][2] - e[5][2] * in[4][3];
    fVar21 = in[5][3] * e[4][3] - e[5][3] * in[6][3];
    fVar22 = e[4][0] * 0.0 + e[5][0] * 0.0;
    fVar25 = in[2][3] * e[4][1] + in[1][3] * e[5][1];
    fVar26 = in[4][3] * e[4][2] + in[3][3] * e[5][2];
    fVar27 = in[6][3] * e[4][3] + in[5][3] * e[5][3];
    fVar55 = fVar39 + 0.0;
    fVar56 = in[1][0] + fVar41;
    fVar57 = in[3][0] + fVar43;
    fVar58 = in[5][0] + fVar45;
    fVar39 = 0.0 - fVar39;
    fVar41 = in[1][0] - fVar41;
    fVar43 = in[3][0] - fVar43;
    fVar45 = in[5][0] - fVar45;
    fVar40 = fVar28 + fVar17;
    fVar42 = fVar29 + fVar19;
    fVar44 = fVar30 + fVar20;
    fVar46 = fVar31 + fVar21;
    fVar17 = fVar17 - fVar28;
    fVar19 = fVar19 - fVar29;
    fVar20 = fVar20 - fVar30;
    fVar21 = fVar21 - fVar31;
    fVar28 = fVar47 + 0.0;
    fVar29 = in[2][0] + fVar49;
    fVar30 = in[4][0] + fVar51;
    fVar31 = in[6][0] + fVar53;
    fVar47 = 0.0 - fVar47;
    fVar49 = in[2][0] - fVar49;
    fVar51 = in[4][0] - fVar51;
    fVar53 = in[6][0] - fVar53;
    fVar48 = fVar32 + fVar22;
    fVar50 = fVar34 + fVar25;
    fVar52 = fVar36 + fVar26;
    fVar54 = fVar37 + fVar27;
    fVar22 = fVar22 - fVar32;
    fVar25 = fVar25 - fVar34;
    fVar26 = fVar26 - fVar36;
    fVar27 = fVar27 - fVar37;
    (*out)[0] = fVar55 + fVar40;
    (*out)[1] = fVar56 + fVar42;
    (*out)[2] = fVar57 + fVar44;
    (*out)[3] = fVar58 + fVar46;
    out[1][0] = fVar28 + fVar48;
    out[1][1] = fVar29 + fVar50;
    out[1][2] = fVar30 + fVar52;
    out[1][3] = fVar31 + fVar54;
    out[2][0] = fVar39 + fVar22;
    out[2][1] = fVar41 + fVar25;
    out[2][2] = fVar43 + fVar26;
    out[2][3] = fVar45 + fVar27;
    out[3][0] = fVar17 - fVar47;
    out[3][1] = fVar19 - fVar49;
    out[3][2] = fVar20 - fVar51;
    out[3][3] = fVar21 - fVar53;
    out[4][0] = fVar39 - fVar22;
    out[4][1] = fVar41 - fVar25;
    out[4][2] = fVar43 - fVar26;
    out[4][3] = fVar45 - fVar27;
    out[5][0] = fVar47 + fVar17;
    out[5][1] = fVar49 + fVar19;
    out[5][2] = fVar51 + fVar20;
    out[5][3] = fVar53 + fVar21;
    out[6][0] = fVar55 - fVar40;
    out[6][1] = fVar56 - fVar42;
    out[6][2] = fVar57 - fVar44;
    out[6][3] = fVar58 - fVar46;
    out[7][0] = fVar48 - fVar28;
    out[7][1] = fVar50 - fVar29;
    out[7][2] = fVar52 - fVar30;
    out[7][3] = fVar54 - fVar31;
    fVar17 = fVar23 + fVar15;
    fVar19 = fVar38 + fVar16;
    (*out)[0] = fVar17 + fVar19;
    out[1][0] = fVar17 - fVar19;
    out[4][0] = fVar23 - fVar15;
    out[5][0] = fVar16 - fVar38;
    fVar23 = fVar14 - fVar10;
    out[2][0] = fVar23 * 0.70710677 + fVar8;
    fVar14 = (fVar10 + fVar14) * -0.70710677;
    out[3][0] = fVar14 - fVar9;
    out[6][0] = fVar23 * -0.70710677 + fVar8;
    out[7][0] = fVar14 + fVar9;
    pafVar11 = e + 0xb;
    lVar13 = 0xf0;
    for (lVar12 = 1; lVar12 < Ncvec / 4; lVar12 = lVar12 + 1) {
      pfVar1 = (float *)((long)*in + lVar13);
      fVar8 = *pfVar1;
      fVar14 = pfVar1[1];
      fVar9 = pfVar1[2];
      fVar10 = pfVar1[3];
      pfVar1 = (float *)((long)in[-7] + lVar13);
      pfVar2 = (float *)((long)in[-6] + lVar13);
      pfVar3 = (float *)((long)in[-5] + lVar13);
      pfVar4 = (float *)((long)in[-4] + lVar13);
      pfVar5 = (float *)((long)in[-3] + lVar13);
      pfVar6 = (float *)((long)in[-2] + lVar13);
      pfVar7 = (float *)((long)in[-1] + lVar13);
      fVar39 = fVar33 * pafVar11[-5][0] - pafVar11[-4][0] * pfVar1[1];
      fVar41 = pfVar2[1] * pafVar11[-5][1] - pafVar11[-4][1] * pfVar3[1];
      fVar43 = pfVar4[1] * pafVar11[-5][2] - pafVar11[-4][2] * pfVar5[1];
      fVar45 = pfVar6[1] * pafVar11[-5][3] - pafVar11[-4][3] * pfVar7[1];
      fVar47 = pfVar1[1] * pafVar11[-5][0] + fVar33 * pafVar11[-4][0];
      fVar49 = pfVar3[1] * pafVar11[-5][1] + pfVar2[1] * pafVar11[-4][1];
      fVar51 = pfVar5[1] * pafVar11[-5][2] + pfVar4[1] * pafVar11[-4][2];
      fVar53 = pfVar7[1] * pafVar11[-5][3] + pfVar6[1] * pafVar11[-4][3];
      fVar28 = fVar35 * pafVar11[-3][0] - pafVar11[-2][0] * pfVar1[2];
      fVar25 = pfVar2[2] * pafVar11[-3][1] - pafVar11[-2][1] * pfVar3[2];
      fVar26 = pfVar4[2] * pafVar11[-3][2] - pafVar11[-2][2] * pfVar5[2];
      fVar27 = pfVar6[2] * pafVar11[-3][3] - pafVar11[-2][3] * pfVar7[2];
      fVar33 = pfVar1[2] * pafVar11[-3][0] + fVar35 * pafVar11[-2][0];
      fVar35 = pfVar3[2] * pafVar11[-3][1] + pfVar2[2] * pafVar11[-2][1];
      fVar23 = pfVar5[2] * pafVar11[-3][2] + pfVar4[2] * pafVar11[-2][2];
      fVar38 = pfVar7[2] * pafVar11[-3][3] + pfVar6[2] * pafVar11[-2][3];
      fVar15 = fVar18 * pafVar11[-1][0] - (*pafVar11)[0] * pfVar1[3];
      fVar16 = pfVar2[3] * pafVar11[-1][1] - (*pafVar11)[1] * pfVar3[3];
      fVar17 = pfVar4[3] * pafVar11[-1][2] - (*pafVar11)[2] * pfVar5[3];
      fVar19 = pfVar6[3] * pafVar11[-1][3] - (*pafVar11)[3] * pfVar7[3];
      fVar18 = pfVar1[3] * pafVar11[-1][0] + fVar18 * (*pafVar11)[0];
      fVar20 = pfVar3[3] * pafVar11[-1][1] + pfVar2[3] * (*pafVar11)[1];
      fVar21 = pfVar5[3] * pafVar11[-1][2] + pfVar4[3] * (*pafVar11)[2];
      fVar22 = pfVar7[3] * pafVar11[-1][3] + pfVar6[3] * (*pafVar11)[3];
      fVar40 = fVar24 + fVar28;
      fVar42 = *pfVar2 + fVar25;
      fVar44 = *pfVar4 + fVar26;
      fVar46 = *pfVar6 + fVar27;
      fVar24 = fVar24 - fVar28;
      fVar25 = *pfVar2 - fVar25;
      fVar26 = *pfVar4 - fVar26;
      fVar27 = *pfVar6 - fVar27;
      fVar28 = fVar39 + fVar15;
      fVar29 = fVar41 + fVar16;
      fVar30 = fVar43 + fVar17;
      fVar31 = fVar45 + fVar19;
      fVar15 = fVar15 - fVar39;
      fVar16 = fVar16 - fVar41;
      fVar17 = fVar17 - fVar43;
      fVar19 = fVar19 - fVar45;
      fVar39 = *pfVar1 + fVar33;
      fVar41 = *pfVar3 + fVar35;
      fVar43 = *pfVar5 + fVar23;
      fVar45 = *pfVar7 + fVar38;
      fVar33 = *pfVar1 - fVar33;
      fVar35 = *pfVar3 - fVar35;
      fVar23 = *pfVar5 - fVar23;
      fVar38 = *pfVar7 - fVar38;
      fVar32 = fVar47 + fVar18;
      fVar34 = fVar49 + fVar20;
      fVar36 = fVar51 + fVar21;
      fVar37 = fVar53 + fVar22;
      fVar18 = fVar18 - fVar47;
      fVar20 = fVar20 - fVar49;
      fVar21 = fVar21 - fVar51;
      fVar22 = fVar22 - fVar53;
      pfVar1 = (float *)((long)out[-7] + lVar13);
      *pfVar1 = fVar40 + fVar28;
      pfVar1[1] = fVar42 + fVar29;
      pfVar1[2] = fVar44 + fVar30;
      pfVar1[3] = fVar46 + fVar31;
      pfVar1 = (float *)((long)out[-6] + lVar13);
      *pfVar1 = fVar39 + fVar32;
      pfVar1[1] = fVar41 + fVar34;
      pfVar1[2] = fVar43 + fVar36;
      pfVar1[3] = fVar45 + fVar37;
      pfVar1 = (float *)((long)out[-5] + lVar13);
      *pfVar1 = fVar24 + fVar18;
      pfVar1[1] = fVar25 + fVar20;
      pfVar1[2] = fVar26 + fVar21;
      pfVar1[3] = fVar27 + fVar22;
      pfVar1 = (float *)((long)out[-4] + lVar13);
      *pfVar1 = fVar15 - fVar33;
      pfVar1[1] = fVar16 - fVar35;
      pfVar1[2] = fVar17 - fVar23;
      pfVar1[3] = fVar19 - fVar38;
      pfVar1 = (float *)((long)out[-3] + lVar13);
      *pfVar1 = fVar24 - fVar18;
      pfVar1[1] = fVar25 - fVar20;
      pfVar1[2] = fVar26 - fVar21;
      pfVar1[3] = fVar27 - fVar22;
      pfVar1 = (float *)((long)out[-2] + lVar13);
      *pfVar1 = fVar33 + fVar15;
      pfVar1[1] = fVar35 + fVar16;
      pfVar1[2] = fVar23 + fVar17;
      pfVar1[3] = fVar38 + fVar19;
      pfVar1 = (float *)((long)out[-1] + lVar13);
      *pfVar1 = fVar40 - fVar28;
      pfVar1[1] = fVar42 - fVar29;
      pfVar1[2] = fVar44 - fVar30;
      pfVar1[3] = fVar46 - fVar31;
      pfVar1 = (float *)((long)*out + lVar13);
      *pfVar1 = fVar32 - fVar39;
      pfVar1[1] = fVar34 - fVar41;
      pfVar1[2] = fVar36 - fVar43;
      pfVar1[3] = fVar37 - fVar45;
      pafVar11 = pafVar11 + 6;
      lVar13 = lVar13 + 0x80;
      fVar24 = fVar8;
      fVar33 = fVar14;
      fVar35 = fVar9;
      fVar18 = fVar10;
    }
    return;
  }
  __assert_fail("in != out",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jcj83429[P]ShapingClipper/pffft.c"
                ,0x5cc,"void pffft_real_finalize(int, const v4sf *, v4sf *, const v4sf *)");
}

Assistant:

static NEVER_INLINE(void) pffft_real_finalize(int Ncvec, const v4sf *in, v4sf *out, const v4sf *e) {
  int k, dk = Ncvec/SIMD_SZ; // number of 4x4 matrix blocks
  /* fftpack order is f0r f1r f1i f2r f2i ... f(n-1)r f(n-1)i f(n)r */

  v4sf_union cr, ci, *uout = (v4sf_union*)out;
  v4sf save = in[7], zero=VZERO();
  float xr0, xi0, xr1, xi1, xr2, xi2, xr3, xi3;
  static const float s = M_SQRT2/2;

  cr.v = in[0]; ci.v = in[Ncvec*2-1];
  assert(in != out);
  pffft_real_finalize_4x4(&zero, &zero, in+1, e, out);

  /*
    [cr0 cr1 cr2 cr3 ci0 ci1 ci2 ci3]

    [Xr(1)]  ] [1   1   1   1   0   0   0   0]
    [Xr(N/4) ] [0   0   0   0   1   s   0  -s]
    [Xr(N/2) ] [1   0  -1   0   0   0   0   0]
    [Xr(3N/4)] [0   0   0   0   1  -s   0   s]
    [Xi(1)   ] [1  -1   1  -1   0   0   0   0]
    [Xi(N/4) ] [0   0   0   0   0  -s  -1  -s]
    [Xi(N/2) ] [0  -1   0   1   0   0   0   0]
    [Xi(3N/4)] [0   0   0   0   0  -s   1  -s]
  */

  xr0=(cr.f[0]+cr.f[2]) + (cr.f[1]+cr.f[3]); uout[0].f[0] = xr0;
  xi0=(cr.f[0]+cr.f[2]) - (cr.f[1]+cr.f[3]); uout[1].f[0] = xi0;
  xr2=(cr.f[0]-cr.f[2]);                     uout[4].f[0] = xr2;
  xi2=(cr.f[3]-cr.f[1]);                     uout[5].f[0] = xi2;
  xr1= ci.f[0] + s*(ci.f[1]-ci.f[3]);        uout[2].f[0] = xr1;
  xi1=-ci.f[2] - s*(ci.f[1]+ci.f[3]);        uout[3].f[0] = xi1;
  xr3= ci.f[0] - s*(ci.f[1]-ci.f[3]);        uout[6].f[0] = xr3;
  xi3= ci.f[2] - s*(ci.f[1]+ci.f[3]);        uout[7].f[0] = xi3; 

  for (k=1; k < dk; ++k) {
    v4sf save_next = in[8*k+7];
    pffft_real_finalize_4x4(&save, &in[8*k+0], in + 8*k+1,
                           e + k*6, out + k*8);
    save = save_next;
  }

}